

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall FTexture::~FTexture(FTexture *this)

{
  FTexture *pFVar1;
  FTexture *link;
  FTexture *this_local;
  
  this->_vptr_FTexture = (_func_int **)&PTR__FTexture_00b88190;
  pFVar1 = FWadCollection::GetLinkedTexture(&Wads,this->SourceLump);
  if (pFVar1 == this) {
    FWadCollection::SetLinkedTexture(&Wads,this->SourceLump,(FTexture *)0x0);
  }
  KillNative(this);
  MiscGLInfo::~MiscGLInfo(&this->gl_info);
  FString::~FString(&this->Name);
  return;
}

Assistant:

FTexture::~FTexture ()
{
	FTexture *link = Wads.GetLinkedTexture(SourceLump);
	if (link == this) Wads.SetLinkedTexture(SourceLump, NULL);
	KillNative();
}